

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall UnscentedKalmanFilter_init_Test::TestBody(UnscentedKalmanFilter_init_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  float local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__1;
  UnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ukfMatrix;
  AssertHelper local_118;
  Message local_110 [3];
  float local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  UnscentedKalmanFilter_init_Test *this_local;
  
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ = this;
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)&gtest_ar_.message_,1.0,2.0,1.0);
  local_f4 = Eigen::NumTraits<float>::dummy_precision();
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma,&local_f4
                    );
  testing::AssertionResult::AssertionResult((AssertionResult *)local_f0,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x20),(internal *)local_f0,(AssertionResult *)"ukf.P.isIdentity()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string
              ((string *)
               ((long)&ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x20));
    testing::Message::~Message(local_110);
  }
  ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (float)(uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  if (ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
      super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] == 0.0)
  {
    Kalman::UnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnscentedKalmanFilter
              ((UnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               ((long)&gtest_ar__1.message_.ptr_ + 4),1.0,2.0,1.0);
    local_224 = Eigen::NumTraits<float>::dummy_precision();
    bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                      ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                       &ukfMatrix.
                        super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.gamma,
                       &local_224);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_220,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_258,(internal *)local_220,(AssertionResult *)"ukfMatrix.P.isIdentity()",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_238,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                 ,0x12,pcVar2);
      testing::internal::AssertHelper::operator=(&local_238,&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      testing::Message::~Message(&local_230);
    }
    ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         (float)(uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, init) {
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(1,2,1);
    ASSERT_TRUE(ukf.P.isIdentity()); // P should be identity

    // Same as above, but with general matrix type instead of vector
    auto ukfMatrix = UnscentedKalmanFilter<Matrix<T, 3, 1>>(1,2,1);
    ASSERT_TRUE(ukfMatrix.P.isIdentity()); // P should be identity
}